

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.hpp
# Opt level: O2

uint FMB::CliqueFinder::findMaxCliqueSize
               (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                *Ngraph)

{
  Stack<unsigned_int> *clique;
  bool bVar1;
  ulong uVar2;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> **ppDVar3;
  uint uVar4;
  Entry *pEVar5;
  uint *puVar6;
  Entry *pEVar7;
  uint uVar8;
  long lVar9;
  undefined1 local_90 [16];
  undefined8 uStack_80;
  Entry *local_78;
  Entry *local_70;
  Stack<unsigned_int> local_68;
  IteratorBase local_48;
  
  local_78 = (Entry *)0x0;
  local_90._8_4_ = 0;
  local_90._12_4_ = 0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  Lib::DArray<Lib::Stack<unsigned_int>_>::ensure
            ((DArray<Lib::Stack<unsigned_int>_> *)(local_90 + 8),(ulong)(Ngraph->_size + 1));
  local_48._next = Ngraph->_entries;
  local_48._last = Ngraph->_afterLast;
  local_48._timestamp = Ngraph->_timestamp;
  while (bVar1 = Lib::
                 DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::IteratorBase::hasNext(&local_48), bVar1) {
    uVar8 = (local_48._next)->_key;
    lVar9 = (ulong)(uint)((local_48._next)->_val->_map)._size << 5;
    local_48._next = local_48._next + 1;
    for (; lVar9 != 0; lVar9 = lVar9 + -0x20) {
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)((long)&local_78->field_0 + lVar9),uVar8);
    }
  }
  uVar8 = local_90._8_4_;
LAB_0025a108:
  do {
    uVar4 = uVar8;
    pEVar5 = (Entry *)(ulong)uVar4;
    uVar8 = uVar4 - 1;
    if (uVar8 < 2) {
      uVar4 = 1;
      goto LAB_0025a1f5;
    }
    uVar2 = (ulong)uVar8;
    puVar6 = *(uint **)((long)local_78 + uVar2 * 0x20 + 0x10);
    clique = (Stack<unsigned_int> *)((long)local_78 + uVar2 * 0x20);
    pEVar7 = (Entry *)((long)puVar6 - *(long *)((long)local_78 + uVar2 * 0x20 + 8) >> 2);
    if (pEVar7 != pEVar5) {
      if (pEVar5 < pEVar7) {
        while (local_70 = pEVar5, (uint)local_70 <= (uint)pEVar7) {
          do {
            if (puVar6 == clique->_stack) goto LAB_0025a108;
            uVar4 = puVar6[-1];
            ppDVar3 = Lib::
                      DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::get(Ngraph,uVar4);
            puVar6 = puVar6 + -1;
          } while (((*ppDVar3)->_map)._size != uVar8);
          local_68._cursor = (uint *)0x0;
          local_68._end = (uint *)0x0;
          local_68._capacity = 0;
          local_68._stack = (uint *)0x0;
          Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::domain
                    ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     local_90);
          Lib::Stack<unsigned_int>::loadFromIterator<Lib::VirtualIterator<unsigned_int>>
                    (&local_68,(VirtualIterator<unsigned_int> *)local_90);
          Lib::VirtualIterator<unsigned_int>::~VirtualIterator
                    ((VirtualIterator<unsigned_int> *)local_90);
          Lib::Stack<unsigned_int>::push(&local_68,uVar4);
          bVar1 = checkClique(Ngraph,&local_68);
          pEVar7 = (Entry *)(ulong)((uint)pEVar7 - (uint)!bVar1);
          Lib::Stack<unsigned_int>::~Stack(&local_68);
          uVar4 = (uint)local_70;
          pEVar5 = local_70;
          if (bVar1) goto LAB_0025a1f5;
        }
      }
      goto LAB_0025a108;
    }
    bVar1 = checkClique(Ngraph,clique);
    if (bVar1) {
LAB_0025a1f5:
      Lib::DArray<Lib::Stack<unsigned_int>_>::~DArray
                ((DArray<Lib::Stack<unsigned_int>_> *)(local_90 + 8));
      return uVar4;
    }
  } while( true );
}

Assistant:

static unsigned findMaxCliqueSize(DHMap<unsigned,DHSet<unsigned>*>* Ngraph)
    {
      //std::cout << "findMaxCliqueSize with " << Ngraph->size() << std::endl;

      // at least stores the number of nodes with at least index neighbours
      DArray<Stack<unsigned>> atleast;
      atleast.ensure(Ngraph->size()+1); // the +1 is to protect against a self-loop sneaking in

      DHMap<unsigned,DHSet<unsigned>*>::Iterator miter(*Ngraph);
      while(miter.hasNext()){
        unsigned c;
        DHSet<unsigned>* nbs;
        miter.next(c,nbs);
        unsigned size = nbs->size();
        //std::cout << ">> " << c << ": " << size << std::endl;

        //DHSet<unsigned>::Iterator dit(*nbs);
        //while(dit.hasNext()){ std::cout << dit.next() << std::endl; }

        for(;size>0;size--){
          atleast[size].push(c);
        }
      }
      //std::cout << "Searching" << std::endl;

      for(unsigned i=atleast.size()-1;i>1;i--){
        // in this case we would expect atleast[i] to be the clique
        if(atleast[i].size() == i+1){
          //std::cout << "CASE 1" << std::endl;
          if(checkClique(Ngraph,atleast[i])){
            //std::cout << "FIND(A) max clique of " << (i+1) << std::endl;
            //for(unsigned j=0;j<atleast[i].size();j++){ std::cout << atleast[i][j] << " ";}; std::cout << std::endl;
            return i+1;
          }
        }
        // in this case atleast[i] may contain a clique but cannot be a clique itself
        // we need to look at subsets
        else if (atleast[i].size() > i+1){
          //std::cout << "CASE 2" << std::endl;
          unsigned left = atleast[i].size();
          Stack<unsigned>::Iterator niter(atleast[i]);
          while(niter.hasNext() && left >= i+1){
            unsigned c = niter.next();
            //std::cout << ">> " << c << std::endl;
            auto ns = Ngraph->get(c);
            if(ns->size()==i){
              Stack<unsigned> clique;
              clique.loadFromIterator(ns->iterator());
              clique.push(c);
              if(checkClique(Ngraph,clique)){
                //std::cout << "FIND(B) max clique of " << (i+1) << std::endl;
                return i+1;
              }
              left--;
            }
          }
          //std::cout << "In this case with " << std::left << " left" << std::endl;
        }
      }

      //for(unsigned i=1;i<atleast.size();i++){
      //  std::cout << i << ":"<< atleast[i].size() << std::endl; 
      //}
      return 1;
    }